

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O0

string * __thiscall Book::getPublisher_abi_cxx11_(string *__return_storage_ptr__,Book *this)

{
  Book *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->publisher);
  return __return_storage_ptr__;
}

Assistant:

string Book::getPublisher() const{
	return publisher;
}